

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscriber.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  element_type *peVar2;
  shared_ptr<opentracing::v3::Tracer> local_28;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (1 < argc) {
    anon_unknown.dwarf_10893::setUpTracer(argv[1]);
    anon_unknown.dwarf_10893::setUpSubscriber();
    opentracing::v3::Tracer::Global();
    peVar2 = std::
             __shared_ptr_access<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_28);
    (**(code **)(*(long *)peVar2 + 0x58))();
    std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr(&local_28);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"usage: ");
    poVar1 = std::operator<<(poVar1,*local_18);
    std::operator<<(poVar1," <config-yaml-path>\n");
  }
  argv_local._4_4_ = (uint)(1 >= argc);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
    if (argc < 2) {
        std::cerr << "usage: " << argv[0] << " <config-yaml-path>\n";
        return 1;
    }

    setUpTracer(argv[1]);

    setUpSubscriber();

    opentracing::Tracer::Global()->Close();
    return 0;
}